

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O0

bool __thiscall
jaegertracing::anon_unknown_11::SamplingPriorityVisitor::operator()
          (SamplingPriorityVisitor *this,string *str)

{
  byte bVar1;
  long *plVar2;
  int local_1a4;
  istringstream local_1a0 [4];
  int intValue;
  istringstream iss;
  string *str_local;
  SamplingPriorityVisitor *this_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)str,_S_in);
  local_1a4 = 0;
  plVar2 = (long *)std::istream::operator>>(local_1a0,&local_1a4);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  this_local._7_1_ = (bVar1 & 1) == 0 && 0 < local_1a4;
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return this_local._7_1_;
}

Assistant:

bool operator()(const std::string& str) const
    {
        std::istringstream iss(str);
        auto intValue = 0;
        if (!(iss >> intValue)) {
            return false;
        }
        return intValue > 0;
    }